

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O0

void util::ThreadRename(string *name)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *name_00;
  undefined8 in_stack_fffffffffffffff0;
  char *__lhs;
  
  __lhs = *(char **)(in_FS_OFFSET + 0x28);
  name_00 = (string *)&stack0xffffffffffffffd8;
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffff0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            (in_stack_ffffffffffffffa8);
  SetThreadName((char *)in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(in_stack_ffffffffffffffa8);
  SetInternalName(name_00);
  if (*(char **)(in_FS_OFFSET + 0x28) == __lhs) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void util::ThreadRename(const std::string& name)
{
    SetThreadName(("b-" + name).c_str());
    SetInternalName(name);
}